

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O0

void __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::GetCellUnionBound
          (S2ShapeIndexRegion<S2ShapeIndex> *this,
          vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids)

{
  Iterator *this_00;
  bool bVar1;
  S2CellId last;
  S2CellId SVar2;
  S2CellId local_94;
  uint64 local_8c;
  S2CellId local_84;
  S2CellId first;
  S2CellId local_5c;
  S2CellId local_54;
  S2CellId id;
  S2CellId last_id;
  S2CellId local_3c;
  int local_34;
  uint64 uStack_30;
  int level;
  uint64 local_28;
  S2CellId local_20;
  S2CellId last_index_id;
  vector<S2CellId,_std::allocator<S2CellId>_> *cell_ids_local;
  S2ShapeIndexRegion<S2ShapeIndex> *this_local;
  
  last_index_id.id_ = (uint64)cell_ids;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::clear(cell_ids);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)last_index_id.id_,6);
  S2ShapeIndex::Iterator::Finish(this->iter_);
  bVar1 = S2ShapeIndex::Iterator::Prev(this->iter_);
  if (bVar1) {
    local_20 = S2ShapeIndex::Iterator::id(this->iter_);
    S2ShapeIndex::Iterator::Begin(this->iter_);
    local_28 = (uint64)S2ShapeIndex::Iterator::id(this->iter_);
    uStack_30 = local_20.id_;
    bVar1 = ::operator!=((S2CellId)local_28,local_20);
    if (bVar1) {
      local_3c = S2ShapeIndex::Iterator::id(this->iter_);
      local_34 = S2CellId::GetCommonAncestorLevel(&local_3c,local_20);
      local_34 = local_34 + 1;
      id = S2CellId::parent(&local_20,local_34);
      local_5c = S2ShapeIndex::Iterator::id(this->iter_);
      local_54 = S2CellId::parent(&local_5c,local_34);
      while (bVar1 = ::operator!=(local_54,id), bVar1) {
        SVar2 = S2CellId::range_max(&local_54);
        first = S2ShapeIndex::Iterator::id(this->iter_);
        bVar1 = ::operator<(SVar2,first);
        if (!bVar1) {
          local_84 = S2ShapeIndex::Iterator::id(this->iter_);
          this_00 = this->iter_;
          local_94 = S2CellId::range_max(&local_54);
          local_8c = (uint64)S2CellId::next(&local_94);
          S2ShapeIndex::Iterator::Seek(this_00,(S2CellId)local_8c);
          S2ShapeIndex::Iterator::Prev(this->iter_);
          SVar2.id_ = local_84.id_;
          last = S2ShapeIndex::Iterator::id(this->iter_);
          CoverRange(SVar2,last,(vector<S2CellId,_std::allocator<S2CellId>_> *)last_index_id.id_);
          S2ShapeIndex::Iterator::Next(this->iter_);
        }
        local_54 = S2CellId::next(&local_54);
      }
    }
    SVar2 = S2ShapeIndex::Iterator::id(this->iter_);
    CoverRange(SVar2,local_20,(vector<S2CellId,_std::allocator<S2CellId>_> *)last_index_id.id_);
  }
  return;
}

Assistant:

void S2ShapeIndexRegion<IndexType>::GetCellUnionBound(
    std::vector<S2CellId> *cell_ids) const {
  // We find the range of S2Cells spanned by the index and choose a level such
  // that the entire index can be covered with just a few cells.  There are
  // two cases:
  //
  //  - If the index intersects two or more faces, then for each intersected
  //    face we add one cell to the covering.  Rather than adding the entire
  //    face, instead we add the smallest S2Cell that covers the S2ShapeIndex
  //    cells within that face.
  //
  //  - If the index intersects only one face, then we first find the smallest
  //    cell S that contains the index cells (just like the case above).
  //    However rather than using the cell S itself, instead we repeat this
  //    process for each of its child cells.  In other words, for each
  //    child cell C we add the smallest S2Cell C' that covers the index cells
  //    within C.  This extra step is relatively cheap and produces much
  //    tighter coverings when the S2ShapeIndex consists of a small region
  //    near the center of a large S2Cell.
  //
  // The following code uses only a single Iterator object because creating an
  // Iterator may be relatively expensive for some S2ShapeIndex types (e.g.,
  // it may involve memory allocation).
  cell_ids->clear();
  cell_ids->reserve(6);

  // Find the last S2CellId in the index.
  iter_.Finish();
  if (!iter_.Prev()) return;  // Empty index.
  const S2CellId last_index_id = iter_.id();
  iter_.Begin();
  if (iter_.id() != last_index_id) {
    // The index has at least two cells.  Choose an S2CellId level such that
    // the entire index can be spanned with at most 6 cells (if the index
    // spans multiple faces) or 4 cells (it the index spans a single face).
    int level = iter_.id().GetCommonAncestorLevel(last_index_id) + 1;

    // For each cell C at the chosen level, we compute the smallest S2Cell
    // that covers the S2ShapeIndex cells within C.
    const S2CellId last_id = last_index_id.parent(level);
    for (auto id = iter_.id().parent(level); id != last_id; id = id.next()) {
      // If the cell C does not contain any index cells, then skip it.
      if (id.range_max() < iter_.id()) continue;

      // Find the range of index cells contained by C and then shrink C so
      // that it just covers those cells.
      S2CellId first = iter_.id();
      iter_.Seek(id.range_max().next());
      iter_.Prev();
      CoverRange(first, iter_.id(), cell_ids);
      iter_.Next();
    }
  }
  CoverRange(iter_.id(), last_index_id, cell_ids);
}